

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

void dumpSize(DumpState *D,size_t x)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  lu_byte buff [10];
  byte abStack_3 [3];
  
  lVar2 = 0;
  do {
    lVar3 = lVar2;
    abStack_3[lVar3 + 2] = (byte)x & 0x7f;
    bVar1 = 0x7f < x;
    lVar2 = lVar3 + -1;
    x = x >> 7;
  } while (bVar1);
  abStack_3[2] = abStack_3[2] | 0x80;
  dumpBlock(D,abStack_3 + lVar3 + 2,-(lVar3 + -1));
  return;
}

Assistant:

static void dumpSize (DumpState *D, size_t x) {
  lu_byte buff[DIBS];
  int n = 0;
  do {
    buff[DIBS - (++n)] = x & 0x7f;  /* fill buffer in reverse order */
    x >>= 7;
  } while (x != 0);
  buff[DIBS - 1] |= 0x80;  /* mark last byte */
  dumpVector(D, buff + DIBS - n, n);
}